

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O1

void __thiscall rest_rpc::rpc_client::async_reconnect(rpc_client *this)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  timespec local_18;
  
  reset_socket(this);
  async_connect(this);
  uVar1 = this->connect_timeout_;
  if (0 < (long)uVar1) {
    local_18.tv_sec = uVar1 / 1000;
    local_18.tv_nsec = (uVar1 % 1000) * 1000000;
    do {
      iVar2 = nanosleep(&local_18,&local_18);
      if (iVar2 != -1) {
        return;
      }
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  }
  return;
}

Assistant:

void async_reconnect() {
    reset_socket();
    async_connect();
    std::this_thread::sleep_for(std::chrono::milliseconds(connect_timeout_));
  }